

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager.cpp
# Opt level: O1

void __thiscall
QRestAccessManagerPrivate::verifyThreadAffinity
          (QRestAccessManagerPrivate *this,QObject *contextObject)

{
  long lVar1;
  long lVar2;
  
  lVar1 = QThread::currentThread();
  lVar2 = QObject::thread();
  if (lVar1 != lVar2) {
    QtPrivateLogging::lcQrest();
    if (((byte)QtPrivateLogging::lcQrest::category.field_2.bools.enabledWarning._q_value._M_base.
               _M_i & 1) != 0) {
      verifyThreadAffinity();
    }
  }
  if (contextObject != (QObject *)0x0) {
    lVar1 = QObject::thread();
    lVar2 = QObject::thread();
    if (lVar1 != lVar2) {
      QtPrivateLogging::lcQrest();
      if (((byte)QtPrivateLogging::lcQrest::category.field_2.bools.enabledWarning._q_value._M_base.
                 _M_i & 1) != 0) {
        verifyThreadAffinity();
      }
    }
  }
  return;
}

Assistant:

void QRestAccessManagerPrivate::verifyThreadAffinity(const QObject *contextObject)
{
    Q_Q(QRestAccessManager);
    if (QThread::currentThread() != q->thread()) {
        qCWarning(lcQrest, "QRestAccessManager can only be called in the thread it belongs to");
        Q_ASSERT(false);
    }
    if (contextObject && (contextObject->thread() != q->thread())) {
        qCWarning(lcQrest, "QRestAccessManager: the context object must reside in the same thread");
        Q_ASSERT(false);
    }
}